

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

void __thiscall SGParser::Generator::RegExprDFANode::Setup(RegExprDFANode *this)

{
  pointer ppRVar1;
  RegExprDFANode *pRVar2;
  iterator __position;
  RegExprDFANode *pRVar3;
  bool bVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  pointer puVar5;
  
  switch(this->Type) {
  case Epsilon:
    this->Nullable = true;
    return;
  case And:
    ppRVar1 = (this->Children).
              super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = *ppRVar1;
    if (pRVar2->Nullable == true) {
      bVar4 = ppRVar1[1]->Nullable;
    }
    else {
      bVar4 = false;
    }
    this->Nullable = bVar4;
    if (pRVar2->Nullable == true) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->FirstPos,
                 ((long)*(pointer *)
                         ((long)&(ppRVar1[1]->FirstPos).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + 8) -
                  *(long *)&(ppRVar1[1]->FirstPos).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data >> 2) +
                 ((long)*(pointer *)
                         ((long)&(pRVar2->FirstPos).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + 8) -
                  *(long *)&(pRVar2->FirstPos).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data >> 2));
      ppRVar1 = (this->Children).
                super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar2 = *ppRVar1;
      pRVar3 = ppRVar1[1];
      std::
      __merge<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((pRVar2->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&(pRVar2->FirstPos).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                  8),(pRVar3->FirstPos).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&(pRVar3->FirstPos).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                  8),(this->FirstPos).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->FirstPos,&pRVar2->FirstPos);
    }
    ppRVar1 = (this->Children).
              super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = ppRVar1[1];
    if (pRVar2->Nullable == true) {
      pRVar3 = *ppRVar1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->LastPos,
                 ((long)*(pointer *)
                         ((long)&(pRVar2->FirstPos).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + 8) -
                  *(long *)&(pRVar2->FirstPos).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data >> 2) +
                 ((long)*(pointer *)
                         ((long)&(pRVar3->FirstPos).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + 8) -
                  *(long *)&(pRVar3->FirstPos).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data >> 2));
      puVar5 = (this->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      goto LAB_00143c83;
    }
    this_00 = &this->LastPos;
    goto LAB_00143b7b;
  case Or:
    ppRVar1 = (this->Children).
              super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = *ppRVar1;
    if (pRVar2->Nullable == true) {
      bVar4 = ppRVar1[1]->Nullable;
    }
    else {
      bVar4 = false;
    }
    this->Nullable = bVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->FirstPos,
               ((long)*(pointer *)
                       ((long)&(ppRVar1[1]->FirstPos).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl + 8) -
                *(long *)&(ppRVar1[1]->FirstPos).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data >> 2) +
               ((long)*(pointer *)
                       ((long)&(pRVar2->FirstPos).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl + 8) -
                *(long *)&(pRVar2->FirstPos).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data >> 2));
    puVar5 = (this->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
LAB_00143c83:
    ppRVar1 = (this->Children).
              super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = *ppRVar1;
    pRVar3 = ppRVar1[1];
    std::
    __merge<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((pRVar2->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,
               *(pointer *)
                ((long)&(pRVar2->FirstPos).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)
               ,(pRVar3->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start,
               *(pointer *)
                ((long)&(pRVar3->FirstPos).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)
               ,puVar5);
    return;
  case Star:
    this->Nullable = true;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->FirstPos,
               &(*(this->Children).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start)->FirstPos);
    break;
  case Plus:
    this->Nullable = false;
    goto LAB_00143b6c;
  case Question:
    this->Nullable = true;
LAB_00143b6c:
    pRVar2 = *(this->Children).
              super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_00 = &this->FirstPos;
LAB_00143b7b:
    __x = &pRVar2->FirstPos;
    goto LAB_00143cca;
  case Char:
    this->Nullable = false;
    __position._M_current =
         (this->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->FirstPos,__position,
                 &this->Position);
    }
    else {
      *__position._M_current = this->Position;
      (this->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    break;
  default:
    return;
  }
  __x = &this->FirstPos;
  this_00 = &this->LastPos;
LAB_00143cca:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_00,__x);
  return;
}

Assistant:

void Setup() {
        switch (Type) {
            case NodeType::Epsilon:
                Nullable = true;
                break;

            case NodeType::Char:
                Nullable = false;
                FirstPos.push_back(Position);
                LastPos = FirstPos;
                break;

            case NodeType::Or:
                Nullable = Children[0u]->Nullable && Children[1u]->Nullable;
                FirstPos.resize(Children[0u]->FirstPos.size() + Children[1u]->FirstPos.size());
                std::merge(Children[0u]->FirstPos.begin(), Children[0u]->FirstPos.end(),
                           Children[1u]->FirstPos.begin(), Children[1u]->FirstPos.end(),
                           FirstPos.begin());
                break;

            case NodeType::And:
                // Nullable
                Nullable = Children[0u]->Nullable && Children[1u]->Nullable;
                // FirstPos
                if (Children[0u]->Nullable) {
                    FirstPos.resize(Children[0u]->FirstPos.size() + Children[1u]->FirstPos.size());
                    std::merge(Children[0u]->FirstPos.begin(), Children[0u]->FirstPos.end(),
                               Children[1u]->FirstPos.begin(), Children[1u]->FirstPos.end(),
                               FirstPos.begin());
                } else
                    FirstPos = Children[0u]->FirstPos;
                // LastPos
                if (Children[1u]->Nullable) {
                    LastPos.resize(Children[0u]->FirstPos.size() + Children[1u]->FirstPos.size());
                    std::merge(Children[0u]->FirstPos.begin(), Children[0u]->FirstPos.end(),
                               Children[1u]->FirstPos.begin(), Children[1u]->FirstPos.end(),
                               LastPos.begin());
                } else
                    LastPos = Children[1u]->FirstPos;
                break;

            case NodeType::Star:
                Nullable = true;
                FirstPos = Children[0u]->FirstPos;
                LastPos  = FirstPos;
                break;

            case NodeType::Question:
                Nullable = true;
                FirstPos = Children[0u]->FirstPos;
                break;

            case NodeType::Plus:
                Nullable = false;
                FirstPos = Children[0u]->FirstPos;
                break;

            default:
                break;
        }
    }